

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

Expression * __thiscall
soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,CommaSeparatedList *l)

{
  size_t sVar1;
  long lVar2;
  pool_ref<soul::AST::Expression> *i;
  pool_ref<soul::AST::Expression> *e;
  
  sVar1 = (l->items).numActive;
  if (sVar1 != 0) {
    e = (l->items).items;
    lVar2 = sVar1 << 3;
    do {
      replaceExpression(this,e);
      e = e + 1;
      lVar2 = lVar2 + -8;
    } while (lVar2 != 0);
  }
  return &l->super_Expression;
}

Assistant:

virtual AST::Expression& visit (AST::CommaSeparatedList& l)
    {
        for (auto& i : l.items)
            replaceExpression (i);

        return l;
    }